

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Metadata.cpp
# Opt level: O0

void __thiscall ASDCP::MXF::Track::Dump(Track *this,FILE *stream)

{
  undefined8 uVar1;
  char *pcVar2;
  char local_98 [8];
  char identbuf [128];
  FILE *stream_local;
  Track *this_local;
  
  local_98[0] = '\0';
  identbuf._120_8_ = stream;
  if (stream == (FILE *)0x0) {
    identbuf._120_8_ = _stderr;
  }
  GenericTrack::Dump(&this->super_GenericTrack,(FILE *)identbuf._120_8_);
  uVar1 = identbuf._120_8_;
  pcVar2 = Rational::EncodeString(&this->EditRate,local_98,0x80);
  fprintf((FILE *)uVar1,"  %22s = %s\n","EditRate",pcVar2);
  uVar1 = identbuf._120_8_;
  pcVar2 = i64sz(this->Origin,local_98);
  fprintf((FILE *)uVar1,"  %22s = %s\n","Origin",pcVar2);
  return;
}

Assistant:

void
Track::Dump(FILE* stream)
{
  char identbuf[IdentBufferLen];
  *identbuf = 0;

  if ( stream == 0 )
    stream = stderr;

  GenericTrack::Dump(stream);
  fprintf(stream, "  %22s = %s\n",  "EditRate", EditRate.EncodeString(identbuf, IdentBufferLen));
  fprintf(stream, "  %22s = %s\n",  "Origin", i64sz(Origin, identbuf));
}